

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::record_pipeline_layout
          (StateRecorder *this,VkPipelineLayout pipeline_layout,
          VkPipelineLayoutCreateInfo *create_info,Hash custom_hash)

{
  bool bVar1;
  int iVar2;
  mutex *__mutex;
  Impl *pIVar3;
  VkPipelineLayoutCreateInfo *new_info;
  VkPipelineLayoutCreateInfo *local_78;
  string local_70;
  WorkItem local_50;
  
  __mutex = &this->impl->record_lock;
  pIVar3 = (Impl *)__mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (create_info->pNext == (void *)0x0) {
    local_78 = (VkPipelineLayoutCreateInfo *)0x0;
    bVar1 = Impl::copy_pipeline_layout(pIVar3,create_info,&this->impl->temp_allocator,&local_78);
    pIVar3 = this->impl;
    if (bVar1) {
      local_50.type = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
      local_50.create_info = local_78;
      local_50.handle = (uint64_t)pipeline_layout;
      local_50.custom_hash = custom_hash;
      Impl::push_work_locked(pIVar3,&local_50);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      Impl::pump_synchronized_recording(this->impl,this);
      return true;
    }
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"pNext in VkPipelineLayoutCreateInfo not supported.","");
    log_error_pnext_chain(&local_70,create_info->pNext);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pIVar3 = this->impl;
  }
  Impl::push_unregister_locked<VkPipelineLayout_T*>
            (pIVar3,VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,pipeline_layout);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return false;
}

Assistant:

bool StateRecorder::record_pipeline_layout(VkPipelineLayout pipeline_layout, const VkPipelineLayoutCreateInfo &create_info,
                                           Hash custom_hash)
{
	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		if (create_info.pNext)
		{
			log_error_pnext_chain("pNext in VkPipelineLayoutCreateInfo not supported.", create_info.pNext);
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO, pipeline_layout);
			return false;
		}

		VkPipelineLayoutCreateInfo *new_info = nullptr;
		if (!impl->copy_pipeline_layout(&create_info, impl->temp_allocator, &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			impl->push_unregister_locked(VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO, pipeline_layout);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO, api_object_cast<uint64_t>(pipeline_layout),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}